

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::LookUpEnumValue
          (internal *this,EnumEntry *enums,size_t size,StringPiece name,int *value)

{
  bool bVar1;
  EnumEntry *pEVar2;
  StringPiece y;
  EnumEntry local_48;
  
  y.length_ = name.ptr_;
  local_48.value = 0;
  local_48.name.ptr_ = (char *)size;
  local_48.name.length_ = (stringpiece_ssize_type)y.length_;
  pEVar2 = std::
           __lower_bound<google::protobuf::internal::EnumEntry_const*,google::protobuf::internal::EnumEntry,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(google::protobuf::internal::EnumEntry_const&,google::protobuf::internal::EnumEntry_const&)>>
                     ((EnumEntry *)this,(EnumEntry *)(this + (long)enums * 0x18),&local_48,
                      (_Iter_comp_val<bool_(*)(const_google::protobuf::internal::EnumEntry_&,_const_google::protobuf::internal::EnumEntry_&)>
                       )0x26f64d);
  if ((pEVar2 != (EnumEntry *)(this + (long)enums * 0x18)) &&
     (y.ptr_ = (char *)size, bVar1 = operator==(pEVar2->name,y), bVar1)) {
    *(int *)name.length_ = pEVar2->value;
    return true;
  }
  return false;
}

Assistant:

bool LookUpEnumValue(const EnumEntry* enums, size_t size,
                     StringPiece name, int* value) {
  EnumEntry target{name, 0};
  auto it = std::lower_bound(enums, enums + size, target, EnumCompareByName);
  if (it != enums + size && it->name == name) {
    *value = it->value;
    return true;
  }
  return false;
}